

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeVm.cpp
# Opt level: O0

VmValue * anon_unknown.dwarf_c91b1::TryGetMemberAccessPointerAndOffset
                    (ExpressionContext *ctx,VmInstruction *address,VmConstant *offset,
                    VmConstant **totalOffset)

{
  VmValue **ppVVar1;
  VmConstant *pVVar2;
  VmConstant *pVVar3;
  VmConstant *rhsAsConstant;
  VmConstant *lhsAsConstant;
  VmConstant **totalOffset_local;
  VmConstant *offset_local;
  VmInstruction *address_local;
  ExpressionContext *ctx_local;
  
  if (address->cmd == VM_INST_ADD) {
    ppVVar1 = SmallArray<VmValue_*,_4U>::operator[](&address->arguments,0);
    pVVar2 = getType<VmConstant>(*ppVVar1);
    ppVVar1 = SmallArray<VmValue_*,_4U>::operator[](&address->arguments,1);
    pVVar3 = getType<VmConstant>(*ppVVar1);
    if (((pVVar2 != (VmConstant *)0x0) && (pVVar2->container == (VariableData *)0x0)) &&
       (pVVar3 == (VmConstant *)0x0)) {
      pVVar2 = CreateConstantInt(ctx->allocator,(SynBase *)0x0,offset->iValue + pVVar2->iValue);
      *totalOffset = pVVar2;
      ppVVar1 = SmallArray<VmValue_*,_4U>::operator[](&address->arguments,1);
      return *ppVVar1;
    }
    if (((pVVar3 != (VmConstant *)0x0) && (pVVar3->container == (VariableData *)0x0)) &&
       (pVVar2 == (VmConstant *)0x0)) {
      pVVar2 = CreateConstantInt(ctx->allocator,(SynBase *)0x0,offset->iValue + pVVar3->iValue);
      *totalOffset = pVVar2;
      ppVVar1 = SmallArray<VmValue_*,_4U>::operator[](&address->arguments,0);
      return *ppVVar1;
    }
  }
  return (VmValue *)0x0;
}

Assistant:

VmValue* TryGetMemberAccessPointerAndOffset(ExpressionContext &ctx, VmInstruction *address, VmConstant *offset, VmConstant **totalOffset)
	{
		if(address->cmd == VM_INST_ADD)
		{
			VmConstant *lhsAsConstant = getType<VmConstant>(address->arguments[0]);
			VmConstant *rhsAsConstant = getType<VmConstant>(address->arguments[1]);

			if(lhsAsConstant && !lhsAsConstant->container && !rhsAsConstant)
			{
				*totalOffset = CreateConstantInt(ctx.allocator, NULL, offset->iValue + lhsAsConstant->iValue);

				return address->arguments[1];
			}
			else if(rhsAsConstant && !rhsAsConstant->container && !lhsAsConstant)
			{
				*totalOffset = CreateConstantInt(ctx.allocator, NULL, offset->iValue + rhsAsConstant->iValue);

				return address->arguments[0];
			}
		}

		return NULL;
	}